

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

BOOL Js::JavascriptOperators::OP_BrFncNeqApply(Var instance,ScriptContext *scriptContext)

{
  bool bVar1;
  Type TVar2;
  ThreadContext *pTVar3;
  code *pcVar4;
  bool bVar5;
  bool bVar6;
  BOOL BVar7;
  undefined4 *puVar8;
  RecyclableObject *this;
  FunctionProxy *this_00;
  ProxyEntryPointInfo *entryPoint;
  JavascriptMethod p_Var9;
  
  pTVar3 = scriptContext->threadContext;
  bVar1 = pTVar3->noJsReentrancy;
  pTVar3->noJsReentrancy = true;
  if (instance == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar5) goto LAB_00ab3416;
    *puVar8 = 0;
  }
  else {
    if (((ulong)instance & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)instance & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar5) goto LAB_00ab3416;
      *puVar8 = 0;
      bVar5 = true;
      goto LAB_00ab33fb;
    }
    bVar5 = true;
    if ((ulong)instance >> 0x32 != 0 || ((ulong)instance & 0xffff000000000000) == 0x1000000000000)
    goto LAB_00ab33fb;
  }
  this = UnsafeVarTo<Js::RecyclableObject>(instance);
  if (this == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
    if (!bVar5) goto LAB_00ab3416;
    *puVar8 = 0;
  }
  TVar2 = ((this->type).ptr)->typeId;
  if ((int)TVar2 < 0x58) {
    bVar5 = true;
    if (TVar2 == TypeIds_Function) {
      this_00 = JavascriptFunction::GetFunctionProxy((JavascriptFunction *)instance);
      if (this_00 == (FunctionProxy *)0x0) {
        if (*(FunctionInfo **)((long)instance + 0x28) == (FunctionInfo *)0x0) goto LAB_00ab33fb;
        p_Var9 = FunctionInfo::GetOriginalEntryPoint(*(FunctionInfo **)((long)instance + 0x28));
      }
      else {
        entryPoint = FunctionProxy::GetDefaultEntryPointInfo(this_00);
        p_Var9 = FunctionProxy::GetDirectEntryPoint(this_00,entryPoint);
      }
      bVar5 = p_Var9 != JavascriptFunction::EntryApply;
    }
  }
  else {
    BVar7 = RecyclableObject::IsExternal(this);
    bVar5 = true;
    if (BVar7 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar6) {
LAB_00ab3416:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar8 = 0;
    }
  }
LAB_00ab33fb:
  pTVar3->noJsReentrancy = bVar1;
  return (BOOL)bVar5;
}

Assistant:

BOOL JavascriptOperators::OP_BrFncNeqApply(Var instance, ScriptContext *scriptContext)
     {
         JIT_HELPER_NOT_REENTRANT_HEADER(Op_OP_BrFncNeqApply, reentrancylock, scriptContext->GetThreadContext());
         // JavascriptFunction and !HostDispatch
         if (JavascriptOperators::GetTypeId(instance) == TypeIds_Function)
         {
             FunctionProxy *bod = ((JavascriptFunction *)instance)->GetFunctionProxy();
             if (bod != nullptr)
             {
                 return bod->GetDirectEntryPoint(bod->GetDefaultEntryPointInfo()) != &Js::JavascriptFunction::EntryApply;
             }
             else
             {
                 FunctionInfo* info = ((JavascriptFunction *)instance)->GetFunctionInfo();
                 if (info != nullptr)
                 {
                     return &Js::JavascriptFunction::EntryApply != info->GetOriginalEntryPoint();
                 }
                 else
                 {
                     return true;
                 }
             }
         }

         return true;
         JIT_HELPER_END(Op_OP_BrFncNeqApply);
     }